

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QGenericArrayOps<Header>::emplace<Header>
          (QGenericArrayOps<Header> *this,qsizetype i,Header *args)

{
  Header **ppHVar1;
  qsizetype *pqVar2;
  long lVar3;
  Data *pDVar4;
  qsizetype qVar5;
  long in_FS_OFFSET;
  bool bVar6;
  Inserter local_b8;
  Header tmp;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar4 = (this->super_QArrayDataPointer<Header>).d;
  if ((pDVar4 != (Data *)0x0) &&
     ((pDVar4->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i < 2)) {
    if ((this->super_QArrayDataPointer<Header>).size == i) {
      qVar5 = QArrayDataPointer<Header>::freeSpaceAtEnd(&this->super_QArrayDataPointer<Header>);
      if (qVar5 == 0) goto LAB_00189827;
      Header::Header((this->super_QArrayDataPointer<Header>).ptr +
                     (this->super_QArrayDataPointer<Header>).size,args);
LAB_00189946:
      pqVar2 = &(this->super_QArrayDataPointer<Header>).size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_001898ff;
    }
LAB_00189827:
    if (i == 0) {
      qVar5 = QArrayDataPointer<Header>::freeSpaceAtBegin(&this->super_QArrayDataPointer<Header>);
      if (qVar5 != 0) {
        Header::Header((this->super_QArrayDataPointer<Header>).ptr + -1,args);
        ppHVar1 = &(this->super_QArrayDataPointer<Header>).ptr;
        *ppHVar1 = *ppHVar1 + -1;
        goto LAB_00189946;
      }
    }
  }
  tmp.value.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  tmp.value.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  tmp.value.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  tmp.name.data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
  super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
  super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
  super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
  super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
  super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._M_u._16_8_ =
       &DAT_aaaaaaaaaaaaaaaa;
  tmp.name.data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
  super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
  super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
  super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
  super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
  super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._24_8_ =
       &DAT_aaaaaaaaaaaaaaaa;
  tmp.name.data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
  super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
  super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
  super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
  super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
  super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._M_u._0_8_ =
       &DAT_aaaaaaaaaaaaaaaa;
  tmp.name.data.super__Variant_base<QHttpHeaders::WellKnownHeader,_QByteArray>.
  super__Move_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
  super__Copy_assign_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
  super__Move_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
  super__Copy_ctor_alias<QHttpHeaders::WellKnownHeader,_QByteArray>.
  super__Variant_storage_alias<QHttpHeaders::WellKnownHeader,_QByteArray>._M_u._8_8_ =
       &DAT_aaaaaaaaaaaaaaaa;
  Header::Header(&tmp,args);
  bVar6 = (this->super_QArrayDataPointer<Header>).size != 0;
  QArrayDataPointer<Header>::detachAndGrow
            (&this->super_QArrayDataPointer<Header>,(uint)(i == 0 && bVar6),1,(Header **)0x0,
             (QArrayDataPointer<Header> *)0x0);
  if (i == 0 && bVar6) {
    Header::Header((this->super_QArrayDataPointer<Header>).ptr + -1,&tmp);
    ppHVar1 = &(this->super_QArrayDataPointer<Header>).ptr;
    *ppHVar1 = *ppHVar1 + -1;
    pqVar2 = &(this->super_QArrayDataPointer<Header>).size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    local_b8.sourceCopyConstruct = 0;
    local_b8.nSource = 0;
    local_b8.move = 0;
    local_b8.sourceCopyAssign = 0;
    local_b8.end = (Header *)0x0;
    local_b8.last = (Header *)0x0;
    local_b8.where = (Header *)0x0;
    local_b8.begin = (this->super_QArrayDataPointer<Header>).ptr;
    local_b8.size = (this->super_QArrayDataPointer<Header>).size;
    local_b8.data = &this->super_QArrayDataPointer<Header>;
    Inserter::insertOne(&local_b8,i,&tmp);
    (local_b8.data)->ptr = local_b8.begin;
    (local_b8.data)->size = local_b8.size;
  }
  Header::~Header(&tmp);
LAB_001898ff:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this).insertOne(i, std::move(tmp));
        }
    }